

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::move(Tree *this,size_t node,size_t new_parent,size_t after)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  char msg_5 [32];
  char msg_4 [36];
  char msg_3 [35];
  char msg_2 [35];
  char msg_1 [30];
  size_t in_stack_00000228;
  size_t in_stack_00000230;
  size_t in_stack_00000238;
  Tree *in_stack_00000240;
  char msg [29];
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  char *in_stack_fffffffffffffd88;
  Location *in_stack_fffffffffffffd90;
  undefined1 *in_stack_fffffffffffffdb8;
  Tree *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  Tree *in_stack_fffffffffffffe20;
  char local_1d8 [48];
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  char *local_190;
  undefined1 local_188 [48];
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  char *local_140;
  undefined1 local_138 [48];
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  char *local_f0;
  undefined1 local_e8 [48];
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  char *local_a0;
  char local_98 [48];
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  char *local_50;
  char local_48 [40];
  long local_20;
  long local_18;
  long local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_RSI == -1) {
    builtin_strncpy(local_48,"check failed: (node != NONE)",0x1d);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    Location::Location(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                       CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                       CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                       CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    (*pcVar1)(local_48,0x1d,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffd70 = uStack_68;
    in_stack_fffffffffffffd74 = uStack_64;
    in_stack_fffffffffffffd78 = local_60;
    in_stack_fffffffffffffd7c = uStack_5c;
    in_stack_fffffffffffffd80 = uStack_58;
    in_stack_fffffffffffffd84 = uStack_54;
    in_stack_fffffffffffffd88 = local_50;
  }
  if (local_10 == local_20) {
    builtin_strncpy(local_98,"check failed: (node != after)",0x1e);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    Location::Location(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                       CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                       CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                       CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    (*pcVar1)(local_98,0x1e,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffd70 = uStack_b8;
    in_stack_fffffffffffffd74 = uStack_b4;
    in_stack_fffffffffffffd78 = local_b0;
    in_stack_fffffffffffffd7c = uStack_ac;
    in_stack_fffffffffffffd80 = uStack_a8;
    in_stack_fffffffffffffd84 = uStack_a4;
    in_stack_fffffffffffffd88 = local_a0;
  }
  if (local_18 == -1) {
    memcpy(local_e8,"check failed: (new_parent != NONE)",0x23);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    Location::Location(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                       CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                       CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                       CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    (*pcVar1)(local_e8,0x23,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffd70 = uStack_108;
    in_stack_fffffffffffffd74 = uStack_104;
    in_stack_fffffffffffffd78 = local_100;
    in_stack_fffffffffffffd7c = uStack_fc;
    in_stack_fffffffffffffd80 = uStack_f8;
    in_stack_fffffffffffffd84 = uStack_f4;
    in_stack_fffffffffffffd88 = local_f0;
  }
  if (local_18 == local_10) {
    memcpy(local_138,"check failed: (new_parent != node)",0x23);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    in_stack_fffffffffffffdc0 = *(Tree **)(in_RDI + 0x58);
    in_stack_fffffffffffffdb8 = local_138;
    Location::Location(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                       CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                       CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                       CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    (*(code *)in_stack_fffffffffffffdc0)
              (in_stack_fffffffffffffdb8,0x23,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffd70 = uStack_158;
    in_stack_fffffffffffffd74 = uStack_154;
    in_stack_fffffffffffffd78 = local_150;
    in_stack_fffffffffffffd7c = uStack_14c;
    in_stack_fffffffffffffd80 = uStack_148;
    in_stack_fffffffffffffd84 = uStack_144;
    in_stack_fffffffffffffd88 = local_140;
  }
  if (local_18 == local_20) {
    memcpy(local_188,"check failed: (new_parent != after)",0x24);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    Location::Location(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                       CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                       CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                       CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    (*pcVar1)(local_188,0x24,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffd70 = uStack_1a8;
    in_stack_fffffffffffffd74 = uStack_1a4;
    in_stack_fffffffffffffd78 = local_1a0;
    in_stack_fffffffffffffd7c = uStack_19c;
    in_stack_fffffffffffffd80 = uStack_198;
    in_stack_fffffffffffffd84 = uStack_194;
    in_stack_fffffffffffffd88 = local_190;
  }
  bVar2 = is_root(in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8);
  if (bVar2) {
    builtin_strncpy(local_1d8,"check failed: (! is_root(node))",0x20);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    Location::Location(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                       CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                       CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                       CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
    (*pcVar1)(local_1d8,0x20,*(undefined8 *)(in_RDI + 0x40));
  }
  _rem_hierarchy(in_stack_fffffffffffffe20,
                 CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  _set_hierarchy(in_stack_00000240,in_stack_00000238,in_stack_00000230,in_stack_00000228);
  return;
}

Assistant:

void Tree::move(size_t node, size_t new_parent, size_t after)
{
    _RYML_CB_ASSERT(m_callbacks, node != NONE);
    _RYML_CB_ASSERT(m_callbacks, node != after);
    _RYML_CB_ASSERT(m_callbacks, new_parent != NONE);
    _RYML_CB_ASSERT(m_callbacks, new_parent != node);
    _RYML_CB_ASSERT(m_callbacks, new_parent != after);
    _RYML_CB_ASSERT(m_callbacks,  ! is_root(node));

    _rem_hierarchy(node);
    _set_hierarchy(node, new_parent, after);
}